

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O2

void __thiscall
pybind11::detail::function_call::function_call(function_call *this,function_record *f,handle p)

{
  this->func = f;
  (this->args_convert).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->args_convert).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->args).super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args).super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args).super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->args_convert).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->args_convert).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->args_convert).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->args_ref).super_handle.m_ptr = (PyObject *)0x0;
  (this->kwargs_ref).super_handle.m_ptr = (PyObject *)0x0;
  (this->parent).m_ptr = p.m_ptr;
  (this->init_self).m_ptr = (PyObject *)0x0;
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
            (&this->args,(ulong)f->nargs);
  std::vector<bool,_std::allocator<bool>_>::reserve(&this->args_convert,(ulong)f->nargs);
  return;
}

Assistant:

inline function_call::function_call(const function_record &f, handle p) :
        func(f), parent(p) {
    args.reserve(f.nargs);
    args_convert.reserve(f.nargs);
}